

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall
presolve::HPresolve::shrinkProblem(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  double *pdVar1;
  double dVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pHVar5;
  pointer pbVar6;
  pointer puVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  pair<int,_int> *ppVar12;
  pair<int,_int> *ppVar13;
  HighsMipSolver *mipsolver;
  HighsMipSolverData *pHVar14;
  void *pvVar15;
  HighsOptions *pHVar16;
  pointer puVar17;
  HighsLp *pHVar18;
  _Rb_tree_node_base *p_Var19;
  _Base_ptr p_Var20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var21;
  uint uVar22;
  int iVar23;
  HighsInt *singCol;
  long lVar24;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var25;
  _Base_ptr p_Var26;
  size_type __n;
  pair<int,_int> *ppVar27;
  iterator __first;
  pair<int,_int> *ppVar28;
  uint uVar29;
  long lVar30;
  pointer psVar31;
  ulong uVar32;
  ulong uVar33;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *p_Var34;
  long lVar35;
  _Rb_tree_node_base *p_Var36;
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_bool> pVar37;
  vector<int,_std::allocator<int>_> newColIndex;
  vector<int,_std::allocator<int>_> newRowIndex;
  set<int,_std::less<int>,_std::allocator<int>_> newSet;
  vector<int,_std::allocator<int>_> local_3c0;
  vector<int,_std::allocator<int>_> local_3a8;
  pointer local_390;
  ulong local_388;
  HighsPostsolveStack *local_380;
  pointer local_378;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *local_370;
  undefined1 local_368 [12];
  undefined4 uStack_35c;
  _Base_ptr local_358;
  _Base_ptr local_350;
  _Base_ptr p_Stack_348;
  pointer local_340;
  pointer local_338;
  pointer ppStack_330;
  pointer local_328;
  pointer local_320;
  pointer pHStack_318;
  pointer local_310;
  pointer local_308;
  pointer ppStack_300;
  pointer local_2f8;
  
  uVar29 = this->model->num_col_;
  this->model->num_col_ = 0;
  local_380 = postsolve_stack;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_3c0,(long)(int)uVar29,(allocator_type *)local_368);
  uVar33 = (ulong)uVar29;
  pHVar18 = this->model;
  pbVar3 = (pHVar18->col_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (pHVar18->col_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_388 = uVar33;
  if ((long)(int)uVar29 != 0) {
    lVar35 = 0;
    lVar30 = 0;
    uVar32 = 0;
    do {
      if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar32] == '\0') {
        pHVar18 = this->model;
        iVar23 = pHVar18->num_col_;
        lVar24 = (long)iVar23;
        pHVar18->num_col_ = iVar23 + 1;
        local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar32] = iVar23;
        if (lVar24 < (long)uVar32) {
          pdVar10 = (pHVar18->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start;
          pdVar10[lVar24] = pdVar10[uVar32];
          pdVar10 = (pHVar18->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar10[lVar24] = pdVar10[uVar32];
          pdVar10 = (pHVar18->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar10[lVar24] = pdVar10[uVar32];
          pHVar5 = (pHVar18->integrality_).
                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pHVar5[lVar24] = pHVar5[uVar32];
          pdVar10 = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start;
          pdVar10[lVar24] = pdVar10[uVar32];
          pdVar10 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start;
          pdVar10[lVar24] = pdVar10[uVar32];
          piVar8 = (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[lVar24] = piVar8[uVar32];
          piVar8 = (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar32]] = piVar8[uVar32];
          psVar31 = (this->implRowDualSourceByCol).
                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          operator=(&psVar31[local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar32]]._M_t,
                    (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )((long)&(psVar31->_M_t)._M_impl.field_0x0 + lVar30));
          piVar8 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar32]] = piVar8[uVar32];
          piVar8 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar32]] = piVar8[uVar32];
          if (pbVar4 != pbVar3) {
            pbVar6 = (this->model->col_names_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::operator=
                      ((string *)
                       (pbVar6 + local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar32]),
                       (string *)((long)&(pbVar6->_M_dataplus)._M_p + lVar35));
          }
          puVar7 = (this->changedColFlag).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar7[local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar32]] = puVar7[uVar32];
          uVar33 = local_388;
        }
      }
      else {
        local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar32] = -1;
      }
      uVar32 = uVar32 + 1;
      lVar30 = lVar30 + 0x30;
      lVar35 = lVar35 + 0x20;
    } while (uVar33 != uVar32);
    pHVar18 = this->model;
  }
  local_368._0_8_ = local_368._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            (&this->colDeleted,(long)pHVar18->num_col_,local_368);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->col_cost_,(long)this->model->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->col_lower_,(long)this->model->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->col_upper_,(long)this->model->num_col_);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
            (&this->model->integrality_,(long)this->model->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implColLower,(long)this->model->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implColUpper,(long)this->model->num_col_);
  std::vector<int,_std::allocator<int>_>::resize(&this->colLowerSource,(long)this->model->num_col_);
  std::vector<int,_std::allocator<int>_>::resize(&this->colUpperSource,(long)this->model->num_col_);
  local_370 = &this->implRowDualSourceByCol;
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::resize(local_370,(long)this->model->num_col_);
  std::vector<int,_std::allocator<int>_>::resize(&this->colhead,(long)this->model->num_col_);
  std::vector<int,_std::allocator<int>_>::resize(&this->colsize,(long)this->model->num_col_);
  if (pbVar4 != pbVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->model->col_names_,(long)this->model->num_col_);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->changedColFlag,(long)this->model->num_col_);
  this->numDeletedCols = 0;
  pHVar18 = this->model;
  uVar29 = pHVar18->num_row_;
  pbVar3 = (pHVar18->row_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_378 = (pHVar18->row_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pHVar18->num_row_ = 0;
  local_390 = (pointer)&this->colUpperSource;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_3a8,(long)(int)uVar29,(allocator_type *)local_368);
  if ((ulong)uVar29 != 0) {
    lVar35 = 0;
    lVar30 = 0;
    uVar33 = 0;
    do {
      if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar33] == '\0') {
        pHVar18 = this->model;
        iVar23 = pHVar18->num_row_;
        lVar24 = (long)iVar23;
        pHVar18->num_row_ = iVar23 + 1;
        local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar33] = iVar23;
        if (lVar24 < (long)uVar33) {
          pdVar10 = (pHVar18->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar10[lVar24] = pdVar10[uVar33];
          pdVar10 = (pHVar18->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar10[lVar24] = pdVar10[uVar33];
          pdVar10 = (this->rowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start;
          pdVar10[lVar24] = pdVar10[uVar33];
          pdVar10 = (this->rowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start;
          pdVar10[lVar24] = pdVar10[uVar33];
          pdVar10 = (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar10[lVar24] = pdVar10[uVar33];
          pdVar10 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar10[lVar24] = pdVar10[uVar33];
          piVar8 = (this->rowDualLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[lVar24] = piVar8[uVar33];
          piVar8 = (this->rowDualUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar33]] = piVar8[uVar33];
          psVar31 = (this->colImplSourceByRow).
                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          operator=(&psVar31[local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar33]]._M_t,
                    (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )((long)&(psVar31->_M_t)._M_impl.field_0x0 + lVar30));
          piVar8 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar33]] = piVar8[uVar33];
          piVar8 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar33]] = piVar8[uVar33];
          piVar8 = (this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar33]] = piVar8[uVar33];
          piVar8 = (this->rowsizeImplInt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8[local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar33]] = piVar8[uVar33];
          if (local_378 != pbVar3) {
            pbVar4 = (this->model->row_names_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::operator=
                      ((string *)
                       (pbVar4 + local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar33]),
                       (string *)((long)&(pbVar4->_M_dataplus)._M_p + lVar35));
          }
          puVar7 = (this->changedRowFlag).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar7[local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar33]] = puVar7[uVar33];
        }
      }
      else {
        local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar33] = -1;
      }
      uVar33 = uVar33 + 1;
      lVar30 = lVar30 + 0x30;
      lVar35 = lVar35 + 0x20;
    } while (uVar29 != uVar33);
  }
  pHVar18 = this->model;
  uVar22 = 0;
  uVar29 = 0;
  if (pHVar18->num_col_ != 0) {
    piVar8 = (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (((_Vector_base<int,_std::allocator<int>_> *)&local_390->_M_dataplus)->_M_impl).
             super__Vector_impl_data._M_start;
    uVar33 = 0;
    do {
      lVar30 = (long)piVar8[uVar33];
      if (lVar30 != -1) {
        piVar8[uVar33] =
             local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar30];
      }
      lVar30 = (long)piVar9[uVar33];
      if (lVar30 != -1) {
        piVar9[uVar33] =
             local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar30];
      }
      uVar33 = uVar33 + 1;
      uVar29 = pHVar18->num_col_;
    } while (uVar33 != uVar29);
  }
  if (pHVar18->num_row_ != 0) {
    piVar8 = (this->rowDualLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->rowDualUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar33 = 0;
    do {
      lVar30 = (long)piVar8[uVar33];
      if (lVar30 != -1) {
        piVar8[uVar33] =
             local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar30];
      }
      lVar30 = (long)piVar9[uVar33];
      if (lVar30 != -1) {
        piVar9[uVar33] =
             local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar30];
      }
      uVar33 = uVar33 + 1;
      uVar22 = pHVar18->num_row_;
    } while (uVar33 != uVar22);
    uVar29 = pHVar18->num_col_;
  }
  local_390 = pbVar3;
  if (uVar29 != 0) {
    uVar33 = 0;
    do {
      local_368._8_4_ = _S_red;
      local_358 = (_Base_ptr)0x0;
      local_350 = (_Base_ptr)(local_368 + 8);
      local_340 = (pointer)0x0;
      psVar31 = (local_370->
                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      p_Var36 = &psVar31[uVar33]._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var19 = *(_Base_ptr *)((long)&psVar31[uVar33]._M_t._M_impl.super__Rb_tree_header + 0x10);
      p_Stack_348 = local_350;
      if (p_Var19 != p_Var36) {
        do {
          if (local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)p_Var19[1]._M_color] != -1) {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_emplace_unique<int&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       local_368,
                       local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + (int)p_Var19[1]._M_color);
          }
          p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
        } while (p_Var19 != p_Var36);
        psVar31 = (local_370->
                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
      p_Var34 = &psVar31[uVar33]._M_t;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                (p_Var34);
      if (local_358 != (_Base_ptr)0x0) {
        (p_Var34->_M_impl).super__Rb_tree_header._M_header._M_color = local_368._8_4_;
        (p_Var34->_M_impl).super__Rb_tree_header._M_header._M_parent = local_358;
        (p_Var34->_M_impl).super__Rb_tree_header._M_header._M_left = local_350;
        (p_Var34->_M_impl).super__Rb_tree_header._M_header._M_right = p_Stack_348;
        local_358->_M_parent = &(p_Var34->_M_impl).super__Rb_tree_header._M_header;
        (p_Var34->_M_impl).super__Rb_tree_header._M_node_count = (size_t)local_340;
        local_358 = (_Base_ptr)0x0;
        local_350 = (_Base_ptr)(local_368 + 8);
        local_340 = (pointer)0x0;
        p_Stack_348 = local_350;
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_368);
      uVar33 = uVar33 + 1;
    } while (uVar33 != (uint)this->model->num_col_);
    uVar22 = this->model->num_row_;
  }
  if (uVar22 == 0) {
    __n = 0;
  }
  else {
    uVar33 = 0;
    do {
      local_368._8_4_ = _S_red;
      local_358 = (_Base_ptr)0x0;
      local_350 = (_Base_ptr)(local_368 + 8);
      local_340 = (pointer)0x0;
      psVar31 = (this->colImplSourceByRow).
                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var26 = &psVar31[uVar33]._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var20 = *(_Base_ptr *)((long)&psVar31[uVar33]._M_t._M_impl.super__Rb_tree_header + 0x10);
      p_Stack_348 = local_350;
      if (p_Var20 != p_Var26) {
        do {
          if (local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)p_Var20[1]._M_color] != -1) {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_emplace_unique<int&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       local_368,
                       local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + (int)p_Var20[1]._M_color);
          }
          p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
        } while (p_Var20 != p_Var26);
        psVar31 = (this->colImplSourceByRow).
                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      p_Var34 = &psVar31[uVar33]._M_t;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                (p_Var34);
      if (local_358 != (_Base_ptr)0x0) {
        (p_Var34->_M_impl).super__Rb_tree_header._M_header._M_color = local_368._8_4_;
        (p_Var34->_M_impl).super__Rb_tree_header._M_header._M_parent = local_358;
        (p_Var34->_M_impl).super__Rb_tree_header._M_header._M_left = local_350;
        (p_Var34->_M_impl).super__Rb_tree_header._M_header._M_right = p_Stack_348;
        local_358->_M_parent = &(p_Var34->_M_impl).super__Rb_tree_header._M_header;
        (p_Var34->_M_impl).super__Rb_tree_header._M_node_count = (size_t)local_340;
        local_358 = (_Base_ptr)0x0;
        local_350 = (_Base_ptr)(local_368 + 8);
        local_340 = (pointer)0x0;
        p_Stack_348 = local_350;
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_368);
      uVar33 = uVar33 + 1;
      uVar29 = this->model->num_row_;
    } while (uVar33 != uVar29);
    __n = (size_type)(int)uVar29;
  }
  local_368._0_8_ = local_368._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
            (&this->rowDeleted,__n,local_368);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->row_lower_,(long)this->model->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->model->row_upper_,(long)this->model->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->rowDualLower,(long)this->model->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->rowDualUpper,(long)this->model->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implRowDualLower,(long)this->model->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->implRowDualUpper,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->rowDualLowerSource,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->rowDualUpperSource,(long)this->model->num_row_);
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::resize(&this->colImplSourceByRow,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize(&this->rowroot,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize(&this->rowsize,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize(&this->rowsizeInteger,(long)this->model->num_row_);
  std::vector<int,_std::allocator<int>_>::resize(&this->rowsizeImplInt,(long)this->model->num_row_);
  if (local_378 != local_390) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->model->row_names_,(long)this->model->num_row_);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->changedRowFlag,(long)this->model->num_row_);
  this->numDeletedRows = 0;
  HighsPostsolveStack::compressIndexMaps(local_380,&local_3a8,&local_3c0);
  HighsLinearSumBounds::shrink(&this->impliedRowBounds,&local_3a8,this->model->num_row_);
  HighsLinearSumBounds::shrink(&this->impliedDualRowBounds,&local_3c0,this->model->num_col_);
  pdVar10 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar33 = (ulong)((long)(this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar10) >> 3;
  if ((int)uVar33 != 0) {
    piVar8 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar32 = 0;
    do {
      dVar2 = pdVar10[uVar32];
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        piVar9[uVar32] =
             local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[piVar9[uVar32]];
        piVar8[uVar32] =
             local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[piVar8[uVar32]];
      }
      uVar32 = uVar32 + 1;
    } while ((uVar33 & 0xffffffff) != uVar32);
  }
  _Var11._M_current =
       (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  _Var21._M_current =
       (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (_Var25._M_current = _Var21._M_current; _Var25._M_current != _Var11._M_current;
      _Var25._M_current = _Var25._M_current + 1) {
    *_Var25._M_current =
         local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[*_Var25._M_current];
  }
  local_368._0_4_ = -1;
  _Var21 = std::
           __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (_Var21,_Var11,(_Iter_equals_val<const_int>)local_368);
  if (_Var21._M_current !=
      (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = _Var21._M_current;
  }
  _Var11._M_current =
       (this->changedColIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  _Var21._M_current =
       (this->changedColIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (_Var25._M_current = _Var21._M_current; _Var25._M_current != _Var11._M_current;
      _Var25._M_current = _Var25._M_current + 1) {
    *_Var25._M_current =
         local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[*_Var25._M_current];
  }
  local_368._0_4_ = -1;
  _Var21 = std::
           __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (_Var21,_Var11,(_Iter_equals_val<const_int>)local_368);
  if (_Var21._M_current !=
      (this->changedColIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (this->changedColIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = _Var21._M_current;
  }
  _Var11._M_current =
       (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  _Var21._M_current =
       (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (_Var25._M_current = _Var21._M_current; _Var25._M_current != _Var11._M_current;
      _Var25._M_current = _Var25._M_current + 1) {
    *_Var25._M_current =
         local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[*_Var25._M_current];
  }
  local_368._0_4_ = -1;
  _Var21 = std::
           __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (_Var21,_Var11,(_Iter_equals_val<const_int>)local_368);
  if (_Var21._M_current !=
      (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = _Var21._M_current;
  }
  _Var11._M_current =
       (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  _Var21._M_current =
       (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (_Var25._M_current = _Var21._M_current; _Var25._M_current != _Var11._M_current;
      _Var25._M_current = _Var25._M_current + 1) {
    *_Var25._M_current =
         local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[*_Var25._M_current];
  }
  local_368._0_4_ = 0xffffffff;
  _Var21 = std::
           __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     (_Var21,_Var11,(_Iter_equals_val<const_int>)local_368);
  if (_Var21._M_current !=
      (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = _Var21._M_current;
  }
  ppVar13 = (this->substitutionOpportunities).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppVar12 = (this->substitutionOpportunities).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (ppVar27 = ppVar12; ppVar27 != ppVar13; ppVar27 = ppVar27 + 1) {
    if ((long)ppVar27->first != -1) {
      ppVar27->first =
           local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[ppVar27->first];
      ppVar27->second =
           local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[ppVar27->second];
    }
  }
  uVar32 = (long)ppVar13 - (long)ppVar12;
  uVar33 = uVar32;
  ppVar27 = ppVar12;
  if (0 < (long)uVar32 >> 5) {
    ppVar28 = (pair<int,_int> *)((long)&ppVar12->first + (uVar32 & 0xffffffffffffffe0));
    lVar30 = ((long)uVar32 >> 5) + 1;
    ppVar27 = ppVar12 + 2;
    do {
      if ((ppVar27[-2].first == -1) || (ppVar27[-2].second == -1)) {
        ppVar27 = ppVar27 + -2;
        goto LAB_003081b8;
      }
      if ((ppVar27[-1].first == -1) || (ppVar27[-1].second == -1)) {
        ppVar27 = ppVar27 + -1;
        goto LAB_003081b8;
      }
      if ((ppVar27->first == -1) || (ppVar27->second == -1)) goto LAB_003081b8;
      if ((ppVar27[1].first == -1) || (ppVar27[1].second == -1)) {
        ppVar27 = ppVar27 + 1;
        goto LAB_003081b8;
      }
      lVar30 = lVar30 + -1;
      ppVar27 = ppVar27 + 4;
    } while (1 < lVar30);
    uVar33 = (long)ppVar13 - (long)ppVar28;
    ppVar27 = ppVar28;
  }
  lVar30 = (long)uVar33 >> 3;
  ppVar28 = ppVar27;
  if (lVar30 == 1) {
LAB_00308188:
    ppVar27 = ppVar13;
    if (ppVar28->second == -1) {
      ppVar27 = ppVar28;
    }
    if (ppVar28->first == -1) {
      ppVar27 = ppVar28;
    }
  }
  else if (lVar30 == 2) {
LAB_00308177:
    if ((ppVar27->first != -1) && (ppVar27->second != -1)) {
      ppVar28 = ppVar27 + 1;
      goto LAB_00308188;
    }
  }
  else {
    __first._M_current = ppVar13;
    if (lVar30 != 3) goto LAB_003081f7;
    if ((ppVar27->first != -1) && (ppVar27->second != -1)) {
      ppVar27 = ppVar27 + 1;
      goto LAB_00308177;
    }
  }
LAB_003081b8:
  ppVar28 = ppVar27 + 1;
  __first._M_current = ppVar27;
  if (ppVar28 != ppVar13 && ppVar27 != ppVar13) {
    do {
      if ((ppVar28->first != -1) && (ppVar28->second != -1)) {
        ppVar27->first = ppVar28->first;
        ppVar27->second = ppVar28->second;
        ppVar27 = ppVar27 + 1;
      }
      ppVar28 = ppVar28 + 1;
      __first._M_current = ppVar27;
    } while (ppVar28 != ppVar13);
  }
LAB_003081f7:
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_erase
            (&this->substitutionOpportunities,__first,ppVar12 + uVar32);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::clear(&(this->equations)._M_t);
  local_368._0_8_ = &(this->equations)._M_t._M_impl.super__Rb_tree_header;
  std::
  vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  ::_M_fill_assign(&this->eqiters,(long)this->model->num_row_,(value_type *)local_368);
  local_368._0_8_ = local_368._0_8_ & 0xffffffff00000000;
  pHVar18 = this->model;
  if (pHVar18->num_row_ != 0) {
    iVar23 = 0;
    do {
      dVar2 = (pHVar18->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar23];
      pdVar1 = (pHVar18->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + iVar23;
      if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
        pVar37 = std::
                 _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                 ::_M_emplace_unique<int&,int&>
                           ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                             *)&this->equations,
                            (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + iVar23,(int *)local_368);
        (this->eqiters).
        super__Vector_base<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(int)local_368._0_4_]._M_node =
             pVar37.first._M_node._M_node;
        pHVar18 = this->model;
        iVar23 = local_368._0_4_;
      }
      iVar23 = iVar23 + 1;
      local_368._0_4_ = iVar23;
    } while (iVar23 != pHVar18->num_row_);
  }
  mipsolver = this->mipsolver;
  if (mipsolver != (HighsMipSolver *)0x0) {
    ((mipsolver->mipdata_)._M_t.
     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
     super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->rowMatrixSet = false;
    HighsObjectiveFunction::HighsObjectiveFunction((HighsObjectiveFunction *)local_368,mipsolver);
    pHVar14 = (this->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    *(_Base_ptr *)&(pHVar14->objectiveFunction).numIntegral = local_358;
    (pHVar14->objectiveFunction).model = (HighsLp *)local_368._0_8_;
    (pHVar14->objectiveFunction).objIntScale = (double)CONCAT44(uStack_35c,local_368._8_4_);
    pvVar15 = *(void **)&(pHVar14->objectiveFunction).objectiveNonzeros.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
    *(_Base_ptr *)
     &(pHVar14->objectiveFunction).objectiveNonzeros.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl = local_350;
    *(_Base_ptr *)((long)&(pHVar14->objectiveFunction).objectiveNonzeros + 8) = p_Stack_348;
    *(pointer *)((long)&(pHVar14->objectiveFunction).objectiveNonzeros + 0x10) = local_340;
    local_350 = (_Base_ptr)0x0;
    p_Stack_348 = (_Base_ptr)0x0;
    local_340 = (pointer)0x0;
    if (pvVar15 != (void *)0x0) {
      operator_delete(pvVar15);
    }
    pvVar15 = *(void **)&(pHVar14->objectiveFunction).objectiveVals.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl;
    *(pointer *)
     &(pHVar14->objectiveFunction).objectiveVals.super__Vector_base<double,_std::allocator<double>_>
      ._M_impl = local_338;
    *(pointer *)((long)&(pHVar14->objectiveFunction).objectiveVals + 8) = ppStack_330;
    *(pointer *)((long)&(pHVar14->objectiveFunction).objectiveVals + 0x10) = local_328;
    local_338 = (pointer)0x0;
    ppStack_330 = (pointer)0x0;
    local_328 = (pointer)0x0;
    if (pvVar15 != (void *)0x0) {
      operator_delete(pvVar15);
    }
    pvVar15 = *(void **)&(pHVar14->objectiveFunction).cliquePartitionStart.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
    *(pointer *)
     &(pHVar14->objectiveFunction).cliquePartitionStart.
      super__Vector_base<int,_std::allocator<int>_>._M_impl = local_320;
    *(pointer *)((long)&(pHVar14->objectiveFunction).cliquePartitionStart + 8) = pHStack_318;
    *(pointer *)((long)&(pHVar14->objectiveFunction).cliquePartitionStart + 0x10) = local_310;
    local_320 = (pointer)0x0;
    pHStack_318 = (pointer)0x0;
    local_310 = (pointer)0x0;
    if (pvVar15 != (void *)0x0) {
      operator_delete(pvVar15);
    }
    pvVar15 = *(void **)&(pHVar14->objectiveFunction).colToPartition.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
    *(pointer *)
     &(pHVar14->objectiveFunction).colToPartition.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl = local_308;
    *(pointer *)((long)&(pHVar14->objectiveFunction).colToPartition + 8) = ppStack_300;
    *(pointer *)((long)&(pHVar14->objectiveFunction).colToPartition + 0x10) = local_2f8;
    local_308 = (pointer)0x0;
    ppStack_300 = (pointer)0x0;
    local_2f8 = (pointer)0x0;
    if ((pvVar15 != (void *)0x0) && (operator_delete(pvVar15), local_308 != (pointer)0x0)) {
      operator_delete(local_308);
    }
    if (local_320 != (pointer)0x0) {
      operator_delete(local_320);
    }
    if (local_338 != (pointer)0x0) {
      operator_delete(local_338);
    }
    if (local_350 != (_Base_ptr)0x0) {
      operator_delete(local_350);
    }
    HighsDomain::HighsDomain((HighsDomain *)local_368,this->mipsolver);
    HighsDomain::operator=
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain,
               (HighsDomain *)local_368);
    HighsDomain::~HighsDomain((HighsDomain *)local_368);
    pHVar14 = (this->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    HighsCliqueTable::rebuild
              (&pHVar14->cliquetable,this->model->num_col_,local_380,&pHVar14->domain,&local_3c0,
               &local_3a8);
    HighsImplications::rebuild
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->implications,
               this->model->num_col_,&local_3c0,&local_3a8);
    pHVar16 = this->mipsolver->options_mip_;
    HighsCutPool::HighsCutPool
              ((HighsCutPool *)local_368,this->mipsolver->model_->num_col_,
               (pHVar16->super_HighsOptionsStruct).mip_pool_age_limit,
               (pHVar16->super_HighsOptionsStruct).mip_pool_soft_limit);
    HighsCutPool::operator=
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cutpool,
               (HighsCutPool *)local_368);
    HighsCutPool::~HighsCutPool((HighsCutPool *)local_368);
    pHVar16 = this->mipsolver->options_mip_;
    HighsConflictPool::HighsConflictPool
              ((HighsConflictPool *)local_368,
               (pHVar16->super_HighsOptionsStruct).mip_pool_age_limit * 5,
               (pHVar16->super_HighsOptionsStruct).mip_pool_soft_limit);
    HighsConflictPool::operator=
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->conflictPool,
               (HighsConflictPool *)local_368);
    HighsConflictPool::~HighsConflictPool((HighsConflictPool *)local_368);
    if (local_388 != 0) {
      puVar17 = (this->numProbes).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar33 = 0;
      do {
        if ((long)local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar33] != -1) {
          puVar17[local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar33]] = puVar17[uVar33];
        }
        uVar33 = uVar33 + 1;
      } while (local_388 != uVar33);
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (&this->numProbes,(long)this->model->num_col_);
    HighsLp::setMatrixDimensions(this->model);
    pHVar18 = this->model;
  }
  HighsLp::setMatrixDimensions(pHVar18);
  HPresolveAnalysis::resetNumDeleted(&this->analysis_);
  if (local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HPresolve::shrinkProblem(HighsPostsolveStack& postsolve_stack) {
  HighsInt oldNumCol = model->num_col_;
  model->num_col_ = 0;
  std::vector<HighsInt> newColIndex(oldNumCol);
  const bool have_col_names = model->col_names_.size() > 0;
  assert(!have_col_names ||
         model->col_names_.size() == static_cast<size_t>(oldNumCol));
  for (HighsInt i = 0; i != oldNumCol; ++i) {
    if (colDeleted[i])
      newColIndex[i] = -1;
    else {
      newColIndex[i] = model->num_col_++;
      if (newColIndex[i] < i) {
        model->col_cost_[newColIndex[i]] = model->col_cost_[i];
        model->col_lower_[newColIndex[i]] = model->col_lower_[i];
        model->col_upper_[newColIndex[i]] = model->col_upper_[i];
        assert(!std::isnan(model->col_lower_[newColIndex[i]]));
        assert(!std::isnan(model->col_upper_[newColIndex[i]]));
        model->integrality_[newColIndex[i]] = model->integrality_[i];
        implColLower[newColIndex[i]] = implColLower[i];
        implColUpper[newColIndex[i]] = implColUpper[i];
        colLowerSource[newColIndex[i]] = colLowerSource[i];
        colUpperSource[newColIndex[i]] = colUpperSource[i];
        implRowDualSourceByCol[newColIndex[i]] = implRowDualSourceByCol[i];
        colhead[newColIndex[i]] = colhead[i];
        colsize[newColIndex[i]] = colsize[i];
        if (have_col_names)
          model->col_names_[newColIndex[i]] = std::move(model->col_names_[i]);
        changedColFlag[newColIndex[i]] = changedColFlag[i];
      }
    }
  }
  colDeleted.assign(model->num_col_, false);
  model->col_cost_.resize(model->num_col_);
  model->col_lower_.resize(model->num_col_);
  model->col_upper_.resize(model->num_col_);
  model->integrality_.resize(model->num_col_);
  implColLower.resize(model->num_col_);
  implColUpper.resize(model->num_col_);
  colLowerSource.resize(model->num_col_);
  colUpperSource.resize(model->num_col_);
  implRowDualSourceByCol.resize(model->num_col_);
  colhead.resize(model->num_col_);
  colsize.resize(model->num_col_);
  if (have_col_names) model->col_names_.resize(model->num_col_);
  changedColFlag.resize(model->num_col_);
  numDeletedCols = 0;
  HighsInt oldNumRow = model->num_row_;
  const bool have_row_names = model->row_names_.size() > 0;
  assert(!have_row_names ||
         model->row_names_.size() == static_cast<size_t>(oldNumRow));
  model->num_row_ = 0;
  std::vector<HighsInt> newRowIndex(oldNumRow);
  for (HighsInt i = 0; i != oldNumRow; ++i) {
    if (rowDeleted[i])
      newRowIndex[i] = -1;
    else {
      newRowIndex[i] = model->num_row_++;
      if (newRowIndex[i] < i) {
        model->row_lower_[newRowIndex[i]] = model->row_lower_[i];
        model->row_upper_[newRowIndex[i]] = model->row_upper_[i];
        assert(!std::isnan(model->row_lower_[newRowIndex[i]]));
        assert(!std::isnan(model->row_upper_[newRowIndex[i]]));
        rowDualLower[newRowIndex[i]] = rowDualLower[i];
        rowDualUpper[newRowIndex[i]] = rowDualUpper[i];
        implRowDualLower[newRowIndex[i]] = implRowDualLower[i];
        implRowDualUpper[newRowIndex[i]] = implRowDualUpper[i];
        rowDualLowerSource[newRowIndex[i]] = rowDualLowerSource[i];
        rowDualUpperSource[newRowIndex[i]] = rowDualUpperSource[i];
        colImplSourceByRow[newRowIndex[i]] = colImplSourceByRow[i];
        rowroot[newRowIndex[i]] = rowroot[i];
        rowsize[newRowIndex[i]] = rowsize[i];
        rowsizeInteger[newRowIndex[i]] = rowsizeInteger[i];
        rowsizeImplInt[newRowIndex[i]] = rowsizeImplInt[i];
        if (have_row_names)
          model->row_names_[newRowIndex[i]] = std::move(model->row_names_[i]);
        changedRowFlag[newRowIndex[i]] = changedRowFlag[i];
      }
    }
  }
  for (HighsInt i = 0; i != model->num_col_; ++i) {
    if (colLowerSource[i] != -1)
      colLowerSource[i] = newRowIndex[colLowerSource[i]];
    if (colUpperSource[i] != -1)
      colUpperSource[i] = newRowIndex[colUpperSource[i]];
  }

  for (HighsInt i = 0; i != model->num_row_; ++i) {
    if (rowDualLowerSource[i] != -1)
      rowDualLowerSource[i] = newColIndex[rowDualLowerSource[i]];
    if (rowDualUpperSource[i] != -1)
      rowDualUpperSource[i] = newColIndex[rowDualUpperSource[i]];
  }

  for (HighsInt i = 0; i != model->num_col_; ++i) {
    std::set<HighsInt> newSet;
    std::for_each(implRowDualSourceByCol[i].cbegin(),
                  implRowDualSourceByCol[i].cend(), [&](const HighsInt& row) {
                    if (newRowIndex[row] != -1)
                      newSet.emplace(newRowIndex[row]);
                  });
    implRowDualSourceByCol[i] = std::move(newSet);
  }

  for (HighsInt i = 0; i != model->num_row_; ++i) {
    std::set<HighsInt> newSet;
    std::for_each(colImplSourceByRow[i].cbegin(), colImplSourceByRow[i].cend(),
                  [&](const HighsInt& col) {
                    if (newColIndex[col] != -1)
                      newSet.emplace(newColIndex[col]);
                  });
    colImplSourceByRow[i] = std::move(newSet);
  }
  rowDeleted.assign(model->num_row_, false);
  model->row_lower_.resize(model->num_row_);
  model->row_upper_.resize(model->num_row_);
  rowDualLower.resize(model->num_row_);
  rowDualUpper.resize(model->num_row_);
  implRowDualLower.resize(model->num_row_);
  implRowDualUpper.resize(model->num_row_);
  rowDualLowerSource.resize(model->num_row_);
  rowDualUpperSource.resize(model->num_row_);
  colImplSourceByRow.resize(model->num_row_);
  rowroot.resize(model->num_row_);
  rowsize.resize(model->num_row_);
  rowsizeInteger.resize(model->num_row_);
  rowsizeImplInt.resize(model->num_row_);
  if (have_row_names) model->row_names_.resize(model->num_row_);
  changedRowFlag.resize(model->num_row_);

  numDeletedRows = 0;
  postsolve_stack.compressIndexMaps(newRowIndex, newColIndex);
  impliedRowBounds.shrink(newRowIndex, model->num_row_);
  impliedDualRowBounds.shrink(newColIndex, model->num_col_);

  HighsInt numNnz = Avalue.size();
  for (HighsInt i = 0; i != numNnz; ++i) {
    if (Avalue[i] == 0) continue;
    assert(newColIndex[Acol[i]] != -1);
    assert(newRowIndex[Arow[i]] != -1);
    Acol[i] = newColIndex[Acol[i]];
    Arow[i] = newRowIndex[Arow[i]];
  }

  // update index sets
  for (HighsInt& singCol : singletonColumns) singCol = newColIndex[singCol];
  singletonColumns.erase(
      std::remove(singletonColumns.begin(), singletonColumns.end(), -1),
      singletonColumns.end());

  for (HighsInt& chgCol : changedColIndices) chgCol = newColIndex[chgCol];
  changedColIndices.erase(
      std::remove(changedColIndices.begin(), changedColIndices.end(), -1),
      changedColIndices.end());

  for (HighsInt& singRow : singletonRows) singRow = newRowIndex[singRow];
  singletonRows.erase(
      std::remove(singletonRows.begin(), singletonRows.end(), -1),
      singletonRows.end());

  for (HighsInt& chgRow : changedRowIndices) chgRow = newRowIndex[chgRow];
  changedRowIndices.erase(
      std::remove(changedRowIndices.begin(), changedRowIndices.end(), -1),
      changedRowIndices.end());

  for (auto& rowColPair : substitutionOpportunities) {
    // skip deleted elements
    if (rowColPair.first == -1) continue;
    rowColPair.first = newRowIndex[rowColPair.first];
    rowColPair.second = newColIndex[rowColPair.second];
  }
  substitutionOpportunities.erase(
      std::remove_if(substitutionOpportunities.begin(),
                     substitutionOpportunities.end(),
                     [&](const std::pair<HighsInt, HighsInt>& p) {
                       return p.first == -1 || p.second == -1;
                     }),
      substitutionOpportunities.end());

  // todo remove equation set and replace with a vector of doubleton eqs
  equations.clear();
  eqiters.assign(model->num_row_, equations.end());
  for (HighsInt i = 0; i != model->num_row_; ++i) {
    if (model->row_lower_[i] == model->row_upper_[i])
      eqiters[i] = equations.emplace(rowsize[i], i).first;
  }

  if (mipsolver != nullptr) {
    mipsolver->mipdata_->rowMatrixSet = false;
    mipsolver->mipdata_->objectiveFunction = HighsObjectiveFunction(*mipsolver);
    mipsolver->mipdata_->domain = HighsDomain(*mipsolver);
    mipsolver->mipdata_->cliquetable.rebuild(model->num_col_, postsolve_stack,
                                             mipsolver->mipdata_->domain,
                                             newColIndex, newRowIndex);
    mipsolver->mipdata_->implications.rebuild(model->num_col_, newColIndex,
                                              newRowIndex);
    mipsolver->mipdata_->cutpool =
        HighsCutPool(mipsolver->model_->num_col_,
                     mipsolver->options_mip_->mip_pool_age_limit,
                     mipsolver->options_mip_->mip_pool_soft_limit);
    mipsolver->mipdata_->conflictPool =
        HighsConflictPool(5 * mipsolver->options_mip_->mip_pool_age_limit,
                          mipsolver->options_mip_->mip_pool_soft_limit);

    for (HighsInt i = 0; i != oldNumCol; ++i)
      if (newColIndex[i] != -1) numProbes[newColIndex[i]] = numProbes[i];

    mipsolver->mipdata_->debugSolution.shrink(newColIndex);
    numProbes.resize(model->num_col_);
    // Need to set the constraint matrix dimensions
    model->setMatrixDimensions();
  }
  // Need to set the constraint matrix dimensions
  model->setMatrixDimensions();
  // Need to reset current number of deleted rows and columns in logging
  analysis_.resetNumDeleted();
}